

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigs.h
# Opt level: O0

void __thiscall
sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry::Entry
          (Entry *this,Slot *slot,Connection *conn)

{
  function<void_()> *in_RDX;
  function<void_()> *in_RDI;
  
  std::function<void_()>::function(in_RDI,in_RDX);
  std::shared_ptr<sigs::ConnectionBase>::shared_ptr
            ((shared_ptr<sigs::ConnectionBase> *)in_RDI,(shared_ptr<sigs::ConnectionBase> *)in_RDX);
  in_RDI[1].super__Function_base._M_manager = (_Manager_type)0x0;
  return;
}

Assistant:

Entry(const Slot &slot, Connection conn) noexcept
      : slot_(slot), conn_(std::move(conn)), signal_(nullptr)
    {
    }